

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3auxCloseMethod(sqlite3_vtab_cursor *pCursor)

{
  long *in_RDI;
  Fts3auxCursor *pCsr;
  Fts3Table *pFts3;
  Fts3MultiSegReader *pCsr_00;
  
  pCsr_00 = *(Fts3MultiSegReader **)(*in_RDI + 0x18);
  sqlite3Fts3SegmentsClose((Fts3Table *)0x23ecc1);
  sqlite3Fts3SegReaderFinish(pCsr_00);
  sqlite3_free((void *)0x23ecdb);
  sqlite3_free((void *)0x23ece8);
  sqlite3_free((void *)0x23ecf8);
  sqlite3_free((void *)0x23ed01);
  return 0;
}

Assistant:

static int fts3auxCloseMethod(sqlite3_vtab_cursor *pCursor){
  Fts3Table *pFts3 = ((Fts3auxTable *)pCursor->pVtab)->pFts3Tab;
  Fts3auxCursor *pCsr = (Fts3auxCursor *)pCursor;

  sqlite3Fts3SegmentsClose(pFts3);
  sqlite3Fts3SegReaderFinish(&pCsr->csr);
  sqlite3_free((void *)pCsr->filter.zTerm);
  sqlite3_free(pCsr->zStop);
  sqlite3_free(pCsr->aStat);
  sqlite3_free(pCsr);
  return SQLITE_OK;
}